

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall
SQASTWritingVisitor::writeExprVector
          (SQASTWritingVisitor *this,ArenaVector<SQCompilation::Expr_*> *v)

{
  const_iterator ppEVar1;
  ArenaVector<SQCompilation::Expr_*> *in_RSI;
  OutputStream *in_RDI;
  Expr *e;
  const_iterator __end1;
  const_iterator __begin1;
  ArenaVector<SQCompilation::Expr_*> *__range1;
  uint64_t in_stack_ffffffffffffffb8;
  SQASTWritingVisitor *visitor;
  const_iterator local_20;
  
  visitor = (SQASTWritingVisitor *)in_RDI[1]._vptr_OutputStream;
  ArenaVector<SQCompilation::Expr_*>::size(in_RSI);
  OutputStream::writeUInt64(in_RDI,in_stack_ffffffffffffffb8);
  local_20 = ArenaVector<SQCompilation::Expr_*>::begin(in_RSI);
  ppEVar1 = ArenaVector<SQCompilation::Expr_*>::end(in_RSI);
  for (; local_20 != ppEVar1; local_20 = local_20 + 1) {
    SQCompilation::Node::visit<SQASTWritingVisitor>(&(*local_20)->super_Node,visitor);
  }
  return;
}

Assistant:

void SQASTWritingVisitor::writeExprVector(const ArenaVector<Expr *> &v) {
  stream->writeUInt64(v.size());

  for (auto e : v) {
    e->visit(this);
  }
}